

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  alpha_cluster *paVar5;
  color_quad_u8 (*pacVar6) [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint s_2;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint s;
  long lVar21;
  ulong uVar22;
  uint s_3;
  long lVar23;
  uint E6 [8] [64];
  int local_a38 [128];
  int local_838 [64];
  int aiStack_738 [64];
  int aiStack_638 [64];
  int aiStack_538 [64];
  int aiStack_438 [64];
  int aiStack_338 [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar19 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar13 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar19;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar13 * data;
  uVar19 = ((data + 1) * uVar13) / uVar19;
  if (SUB164(auVar9 / auVar8,0) < (uint)uVar19) {
    uVar13 = SUB168(auVar9 / auVar8,0) & 0xffffffff;
    do {
      if (this->m_num_alpha_blocks - 1 < 0xfffffffe) {
        uVar10 = (int)uVar13 * 2;
        uVar20 = 1;
        do {
          uVar4 = (this->m_params).m_alpha_component_indices[uVar20 - 1];
          uVar22 = uVar13 & 0xffffffff;
          if (this->m_has_subblocks != false) {
            uVar22 = (ulong)uVar10;
          }
          uVar3 = (this->m_endpoint_indices).m_p[uVar22].field_0.component[uVar20];
          paVar5 = (this->m_alpha_clusters).m_p;
          pacVar6 = this->m_blocks;
          lVar17 = 0;
          piVar12 = local_a38;
          do {
            bVar2 = pacVar6[uVar13][lVar17].field_0.c[uVar4];
            lVar21 = 0;
            do {
              iVar14 = (uint)bVar2 -
                       *(int *)((long)paVar5->alpha_values +
                               lVar21 * 4 + (ulong)((uint)uVar3 * 0x90));
              piVar12[lVar21] = iVar14 * iVar14;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 8);
            lVar17 = lVar17 + 1;
            piVar12 = piVar12 + 8;
          } while (lVar17 != 0x10);
          piVar12 = local_838;
          lVar17 = 0;
          do {
            uVar22 = 0;
            do {
              piVar12[uVar22] =
                   local_a38[(lVar17 * 2 + 1) * 8 + (uVar22 >> 3 & 0x1fffffff)] +
                   local_a38[lVar17 * 0x10 + (ulong)((uint)uVar22 & 7)];
              uVar22 = uVar22 + 1;
            } while (uVar22 != 0x40);
            lVar17 = lVar17 + 1;
            piVar12 = piVar12 + 0x40;
          } while (lVar17 != 8);
          uVar22 = (ulong)(this->m_alpha_selectors).m_size;
          if (uVar22 == 0) {
            uVar15 = 0;
          }
          else {
            uVar11 = 0;
            uVar16 = 0xffffffff;
            uVar15 = 0;
            do {
              uVar7 = (this->m_alpha_selectors).m_p[uVar11];
              uVar18 = (uint)(uVar7 >> 0x20);
              uVar18 = *(int *)((long)aiStack_738 + (ulong)((uint)(uVar7 >> 4) & 0xfc)) +
                       local_838[(uint)uVar7 & 0x3f] +
                       *(int *)((long)aiStack_638 + (ulong)((uint)(uVar7 >> 10) & 0xfc)) +
                       *(int *)((long)aiStack_538 + (ulong)((uint)(uVar7 >> 0x10) & 0xfc)) +
                       *(int *)((long)aiStack_438 + (ulong)((uint)(uVar7 >> 0x16) & 0xfc)) +
                       aiStack_338[(uint)(uVar7 >> 0x1e) & 0x3f] + aiStack_238[uVar18 >> 4 & 0x3f] +
                       aiStack_138[uVar18 >> 10 & 0x3f];
              if (uVar18 < uVar16) {
                uVar16 = uVar18;
                uVar15 = (uint)uVar11;
              }
              uVar11 = uVar11 + 1;
            } while (uVar22 != uVar11);
          }
          if (*(char *)((long)paVar5->refined_alpha_values + ((ulong)((uint)uVar3 * 0x90) - 4)) !=
              '\0') {
            pacVar6 = this->m_blocks;
            lVar17 = 0;
            piVar12 = local_a38;
            do {
              bVar2 = pacVar6[uVar13][lVar17].field_0.c[uVar4];
              lVar21 = 0;
              do {
                iVar14 = (uint)bVar2 -
                         *(int *)((long)paVar5->refined_alpha_values +
                                 lVar21 * 4 + (ulong)((uint)uVar3 * 0x90));
                piVar12[lVar21] = iVar14 * iVar14;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 8);
              lVar17 = lVar17 + 1;
              piVar12 = piVar12 + 8;
            } while (lVar17 != 0x10);
          }
          lVar17 = *pData_ptr + (ulong)uVar15 * 0x204;
          lVar21 = 0;
          piVar12 = local_a38;
          do {
            lVar23 = 0;
            do {
              piVar1 = (int *)(lVar17 + lVar23 * 4);
              *piVar1 = *piVar1 + piVar12[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 8);
            lVar21 = lVar21 + 1;
            piVar12 = piVar12 + 8;
            lVar17 = lVar17 + 0x20;
          } while (lVar21 != 0x10);
          *(undefined1 *)(*pData_ptr + 0x200 + (ulong)uVar15 * 0x204) = 1;
          uVar22 = uVar13 & 0xffffffff;
          if (this->m_has_subblocks != false) {
            uVar22 = (ulong)uVar10;
          }
          (this->m_selector_indices).m_p[uVar22].field_0.component[uVar20] = (uint16)uVar15;
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->m_num_alpha_blocks + 1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (uVar19 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E3[16][8];
  uint E6[8][64];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
      const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
      alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
      uint* block_values = cluster.alpha_values;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++) {
          int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
          E3[p][s] = delta * delta;
        }
      }
      for (uint p = 0; p < 8; p++) {
        for (uint s = 0; s < 64; s++)
          E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
      }
      uint best_index = 0;
      for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++) {
        uint64 selector = m_alpha_selectors[s];
        uint error = E6[0][selector & 63];
        error += E6[1][selector >> 6 & 63];
        error += E6[2][selector >> 12 & 63];
        error += E6[3][selector >> 18 & 63];
        error += E6[4][selector >> 24 & 63];
        error += E6[5][selector >> 30 & 63];
        error += E6[6][selector >> 36 & 63];
        error += E6[7][selector >> 42 & 63];
        if (error < best_error) {
          best_error = error;
          best_index = s;
        }
      }
      if (cluster.refined_alpha) {
        block_values = cluster.refined_alpha_values;
        for (uint p = 0; p < 16; p++) {
          for (uint s = 0; s < 8; s++) {
            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
            E3[p][s] = delta * delta;
          }
        }
      }
      uint (&total_errors)[16][8] = selector_details[best_index].error;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++)
         total_errors[p][s] += E3[p][s];
      }
      selector_details[best_index].used = true;
      m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
    }
  }
}